

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O1

PtexCachedReader * __thiscall
Ptex::v2_4::
PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>::pop
          (PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
           *this)

{
  PtexLruItem *pPVar1;
  PtexCachedReader *pPVar2;
  PtexLruItem *pPVar3;
  
  pPVar3 = (this->_end)._next;
  if (pPVar3 == &this->_end) {
    pPVar3 = (PtexLruItem *)0x0;
  }
  else {
    pPVar1 = pPVar3->_next;
    pPVar1->_prev = ((PtexLruItem *)&pPVar3->_prev)->_prev;
    ((PtexLruItem *)&pPVar3->_prev)->_prev->_next = pPVar1;
    ((PtexLruItem *)&pPVar3->_prev)->_prev = pPVar3;
    pPVar3->_next = pPVar3;
  }
  if (PtexLruList<Ptex::v2_4::PtexCachedReader,&Ptex::v2_4::PtexCachedReader::_activeFilesItem>::
      pop()::itemOffset == '\0') {
    PtexLruList<Ptex::v2_4::PtexCachedReader,&Ptex::v2_4::PtexCachedReader::_activeFilesItem>::pop()
    ;
  }
  pPVar2 = (PtexCachedReader *)((long)pPVar3 - pop::itemOffset);
  if (pPVar3 == (PtexLruItem *)0x0) {
    pPVar2 = (PtexCachedReader *)0x0;
  }
  return pPVar2;
}

Assistant:

PtexLruItem* pop() {
        if (_next == this) return 0;
        PtexLruItem* item = _next;
        _next->extract();
        return item;
    }